

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_htmlentities(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  uint local_4c;
  int local_48;
  sxu32 n;
  int c;
  int nLen;
  char *zEnd;
  char *zIn;
  jx9_value **ppjStack_28;
  int iFlags;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zIn._4_4_ = 1;
  ppjStack_28 = apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_null(pjStack_18);
  }
  else {
    zEnd = jx9_value_to_string(*ppjStack_28,(int *)&n);
    _c = zEnd + (int)n;
    if ((1 < apArg_local._4_4_) &&
       (zIn._4_4_ = jx9_value_to_int(ppjStack_28[1]), (int)zIn._4_4_ < 0)) {
      zIn._4_4_ = 1;
    }
    for (; zEnd < _c; zEnd = zEnd + 1) {
      local_48 = (int)*zEnd;
      local_4c = 0;
      while ((local_4c < 0x28 && (*azHtmlEscape[local_4c + 1] != local_48))) {
        local_4c = local_4c + 2;
      }
      if (local_4c < 0x28) {
        if ((local_48 == 0x22) && ((zIn._4_4_ & 4) != 0)) {
          jx9_result_string(pjStack_18,(char *)&local_48,1);
        }
        else if ((local_48 == 0x27) && (((zIn._4_4_ & 2) == 0 || ((zIn._4_4_ & 4) != 0)))) {
          jx9_result_string(pjStack_18,(char *)&local_48,1);
        }
        else {
          jx9_result_string(pjStack_18,azHtmlEscape[local_4c],-1);
        }
      }
      else {
        jx9_result_string(pjStack_18,(char *)&local_48,1);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_htmlentities(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iFlags = 0x01; /* ENT_COMPAT */
	const char *zIn, *zEnd;
	int nLen, c;
	sxu32 n;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	/* Extract the flags if available */
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
		if( iFlags < 0 ){
			iFlags = 0x01;
		}
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		c = zIn[0];
		/* Perform a linear lookup on the decoding table */
		for( n = 0 ; n < SX_ARRAYSIZE(azHtmlEscape) ; n += 2 ){
			if( azHtmlEscape[n+1][0] == c ){
				/* Got one */
				break;
			}
		}
		if( n < SX_ARRAYSIZE(azHtmlEscape) ){
			/* Output the safe sequence [i.e: '<' ==> '&lt;"] */
			if( c == '"' && (iFlags & 0x04) /*ENT_NOQUOTES*/ ){
				/* Expand the double quote verbatim */
				jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
			}else if(c == '\'' && ((iFlags & 0x02 /*ENT_QUOTES*/) == 0 || (iFlags & 0x04) /*ENT_NOQUOTES*/) ){
				/* expand single quote verbatim */
				jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
			}else{
				jx9_result_string(pCtx, azHtmlEscape[n], -1/*Compute length automatically */);
			}
		}else{
			/* Output character verbatim */
			jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
		}
		zIn++;
	}
	return JX9_OK;
}